

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ostream * operator<<(ostream *out,ShapeRange *shape)

{
  ostream *poVar1;
  RangeValue local_38;
  RangeValue local_28;
  
  poVar1 = std::operator<<(out,"[");
  local_28._isUnbound = (shape->_minimum)._isUnbound;
  local_28._val = (shape->_minimum)._val;
  operator<<(poVar1,&local_28);
  poVar1 = std::operator<<(poVar1,", ");
  local_38._isUnbound = (shape->_maximum)._isUnbound;
  local_38._val = (shape->_maximum)._val;
  operator<<(poVar1,&local_38);
  std::operator<<(poVar1,"]");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ShapeRange& shape) {
    out << "[" << shape.minimum() << ", " << shape.maximum() << "]";
    return out;
}